

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy.hpp
# Opt level: O0

vector<Sphere,_std::allocator<Sphere>_> *
sphere_tree_leaves(vector<Sphere,_std::allocator<Sphere>_> *__return_storage_ptr__,SphereTree *tree)

{
  initializer_list<Sphere> __l;
  bool bVar1;
  vector<SphereTree,_std::allocator<SphereTree>_> *this;
  iterator __first;
  iterator __last;
  __normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_> local_98;
  const_iterator local_90;
  undefined1 local_88 [8];
  vector<Sphere,_std::allocator<Sphere>_> v;
  SphereTree *c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range1;
  allocator<Sphere> local_39;
  Sphere local_38;
  iterator local_28;
  size_type local_20;
  SphereTree *local_18;
  SphereTree *tree_local;
  vector<Sphere,_std::allocator<Sphere>_> *res;
  
  local_18 = tree;
  tree_local = (SphereTree *)__return_storage_ptr__;
  bVar1 = std::vector<SphereTree,_std::allocator<SphereTree>_>::empty(&tree->child);
  if (bVar1) {
    local_38.center.x = (local_18->bound).center.x;
    local_38.center.y = (local_18->bound).center.y;
    local_38._8_8_ = *(undefined8 *)&(local_18->bound).center.z;
    local_28 = &local_38;
    local_20 = 1;
    std::allocator<Sphere>::allocator(&local_39);
    __l._M_len = local_20;
    __l._M_array = local_28;
    std::vector<Sphere,_std::allocator<Sphere>_>::vector(__return_storage_ptr__,__l,&local_39);
    std::allocator<Sphere>::~allocator(&local_39);
  }
  else {
    std::vector<Sphere,_std::allocator<Sphere>_>::vector(__return_storage_ptr__);
    this = &local_18->child;
    __end1 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin(this);
    c = (SphereTree *)std::vector<SphereTree,_std::allocator<SphereTree>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                       *)&c), bVar1) {
      v.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           &__gnu_cxx::
            __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
            ::operator*(&__end1)->bound;
      sphere_tree_leaves((vector<Sphere,_std::allocator<Sphere>_> *)local_88,
                         (SphereTree *)
                         v.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      local_98._M_current =
           (Sphere *)std::vector<Sphere,_std::allocator<Sphere>_>::end(__return_storage_ptr__);
      __gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>::
      __normal_iterator<Sphere*>
                ((__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>> *)
                 &local_90,&local_98);
      __first = std::vector<Sphere,_std::allocator<Sphere>_>::begin
                          ((vector<Sphere,_std::allocator<Sphere>_> *)local_88);
      __last = std::vector<Sphere,_std::allocator<Sphere>_>::end
                         ((vector<Sphere,_std::allocator<Sphere>_> *)local_88);
      std::vector<Sphere,std::allocator<Sphere>>::
      insert<__gnu_cxx::__normal_iterator<Sphere*,std::vector<Sphere,std::allocator<Sphere>>>,void>
                ((vector<Sphere,std::allocator<Sphere>> *)__return_storage_ptr__,local_90,
                 (__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>)
                 __first._M_current,
                 (__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>)
                 __last._M_current);
      std::vector<Sphere,_std::allocator<Sphere>_>::~vector
                ((vector<Sphere,_std::allocator<Sphere>_> *)local_88);
      __gnu_cxx::
      __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
      operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sphere> sphere_tree_leaves(const SphereTree& tree)
{
	if (tree.child.empty()) return {tree.bound};
	std::vector<Sphere> res;
	for (const SphereTree& c: tree.child)
	{
		std::vector<Sphere> v = sphere_tree_leaves(c);
		res.insert(res.end(), v.begin(), v.end());
	}
	return res;
}